

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_builder.cpp
# Opt level: O3

void __thiscall ccs::RuleBuilder::Impl::~Impl(Impl *this)

{
  _Atomic_word *p_Var1;
  Nested *pNVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  
  this->_vptr_Impl = (_func_int **)&PTR__Impl_001a8ce8;
  pNVar2 = (this->ast)._M_t.
           super___uniq_ptr_impl<ccs::ast::Nested,_std::default_delete<ccs::ast::Nested>_>._M_t.
           super__Tuple_impl<0UL,_ccs::ast::Nested_*,_std::default_delete<ccs::ast::Nested>_>.
           super__Head_base<0UL,_ccs::ast::Nested_*,_false>._M_head_impl;
  if (pNVar2 != (Nested *)0x0) {
    (*(pNVar2->super_AstRule)._vptr_AstRule[1])();
  }
  (this->ast)._M_t.super___uniq_ptr_impl<ccs::ast::Nested,_std::default_delete<ccs::ast::Nested>_>.
  _M_t.super__Tuple_impl<0UL,_ccs::ast::Nested_*,_std::default_delete<ccs::ast::Nested>_>.
  super__Head_base<0UL,_ccs::ast::Nested_*,_false>._M_head_impl = (Nested *)0x0;
  p_Var3 = (this->super_enable_shared_from_this<ccs::RuleBuilder::Impl>)._M_weak_this.
           super___weak_ptr<ccs::RuleBuilder::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var3->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = p_Var3->_M_weak_count;
      p_Var3->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*p_Var3->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

virtual ~Impl() {}